

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O3

void __thiscall
JsrtDebuggerObjectScope::JsrtDebuggerObjectScope
          (JsrtDebuggerObjectScope *this,JsrtDebuggerObjectsManager *debuggerObjectsManager,
          WeakArenaReference<Js::IDiagObjectModelDisplay> *objectDisplay,uint index)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  JsrtDebuggerObjectBase::JsrtDebuggerObjectBase
            (&this->super_JsrtDebuggerObjectBase,Scope,debuggerObjectsManager);
  (this->super_JsrtDebuggerObjectBase)._vptr_JsrtDebuggerObjectBase =
       (_func_int **)&PTR__JsrtDebuggerObjectScope_014d0260;
  this->objectDisplay = objectDisplay;
  this->walkerRef = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0;
  this->index = index;
  if (objectDisplay == (WeakArenaReference<Js::IDiagObjectModelDisplay> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                       ,0x26c,"(this->objectDisplay != nullptr)","this->objectDisplay != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

JsrtDebuggerObjectScope::JsrtDebuggerObjectScope(JsrtDebuggerObjectsManager * debuggerObjectsManager, WeakArenaReference<Js::IDiagObjectModelDisplay>* objectDisplay, uint index) :
    JsrtDebuggerObjectBase(JsrtDebuggerObjectType::Scope, debuggerObjectsManager),
    objectDisplay(objectDisplay),
    index(index),
    walkerRef(nullptr)
{
    Assert(this->objectDisplay != nullptr);
}